

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86.h
# Opt level: O0

__m128i scan_for_eob(__m128i *coeff0,__m128i *coeff1,__m128i zbin_mask0,__m128i zbin_mask1,
                    int16_t *scan_ptr,int index,__m128i zero)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  __m128i alVar7;
  __m128i eob1;
  __m128i eob0;
  __m128i scan1;
  __m128i scan0;
  __m128i zero_coeff1;
  __m128i zero_coeff0;
  __m128i zero_local;
  int index_local;
  int16_t *scan_ptr_local;
  
  auVar2._8_8_ = in_XMM2_Qb;
  auVar2._0_8_ = in_XMM2_Qa;
  auVar2 = vpcmpeqw_avx((undefined1  [16])*coeff0,auVar2);
  auVar3._8_8_ = in_XMM2_Qb;
  auVar3._0_8_ = in_XMM2_Qa;
  auVar3 = vpcmpeqw_avx((undefined1  [16])*coeff1,auVar3);
  pauVar1 = (undefined1 (*) [16])(zbin_mask0[0] + 0x10 + (long)(int)zbin_mask0[1] * 2);
  auVar5._8_8_ = in_XMM0_Qb;
  auVar5._0_8_ = in_XMM0_Qa;
  auVar5 = vpsubw_avx(*(undefined1 (*) [16])(zbin_mask0[0] + (long)(int)zbin_mask0[1] * 2),auVar5);
  auVar4._8_8_ = in_XMM1_Qb;
  auVar4._0_8_ = in_XMM1_Qa;
  auVar6 = vpsubw_avx(*pauVar1,auVar4);
  auVar4 = vpcmpeqd_avx(auVar2,auVar2);
  auVar5 = vpandn_avx(auVar2,auVar5);
  auVar2 = vpand_avx(auVar3 ^ auVar4,auVar6);
  vpmaxsw_avx(auVar5,auVar2);
  alVar7[1] = zbin_mask0[0];
  alVar7[0] = (longlong)pauVar1;
  return alVar7;
}

Assistant:

static inline __m128i scan_for_eob(__m128i *coeff0, __m128i *coeff1,
                                   const __m128i zbin_mask0,
                                   const __m128i zbin_mask1,
                                   const int16_t *scan_ptr, const int index,
                                   const __m128i zero) {
  const __m128i zero_coeff0 = _mm_cmpeq_epi16(*coeff0, zero);
  const __m128i zero_coeff1 = _mm_cmpeq_epi16(*coeff1, zero);
  __m128i scan0 = _mm_load_si128((const __m128i *)(scan_ptr + index));
  __m128i scan1 = _mm_load_si128((const __m128i *)(scan_ptr + index + 8));
  __m128i eob0, eob1;
  // Add one to convert from indices to counts
  scan0 = _mm_sub_epi16(scan0, zbin_mask0);
  scan1 = _mm_sub_epi16(scan1, zbin_mask1);
  eob0 = _mm_andnot_si128(zero_coeff0, scan0);
  eob1 = _mm_andnot_si128(zero_coeff1, scan1);
  return _mm_max_epi16(eob0, eob1);
}